

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  size_type sVar1;
  undefined8 *in_RSI;
  int in_EDI;
  Session session;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_00000070;
  int i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  fnameSessions;
  char *in_stack_000001e0;
  Session *in_stack_000001e8;
  value_type *in_stack_ffffffffffffff58;
  Session *in_stack_ffffffffffffff60;
  undefined1 *in_stack_ffffffffffffff68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff70;
  undefined7 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7f;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  string local_78 [8];
  ImFontAtlas *in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  int local_2c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_28;
  undefined8 *local_10;
  int local_8;
  int local_4;
  
  local_4 = 0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  printf("Usage: %s session0.imdd [session1.imdd] [session2.imdd] [...]\n",*in_RSI);
  if (local_8 < 2) {
    local_4 = -1;
  }
  else {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x1075f1);
    for (local_2c = 1; local_2c < local_8; local_2c = local_2c + 1) {
      printf("[+] Session \'%s\' info:\n",local_10[local_2c]);
      in_stack_ffffffffffffff70 = &local_58;
      Session::Session((Session *)0x10763a);
      in_stack_ffffffffffffff7f = Session::load(in_stack_000001e8,in_stack_000001e0);
      if ((bool)in_stack_ffffffffffffff7f) {
        Session::printInfo(in_stack_ffffffffffffff60);
        in_stack_ffffffffffffff60 = (Session *)local_10[local_2c];
        in_stack_ffffffffffffff68 = &stack0xffffffffffffff87;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                   (allocator<char> *)in_stack_ffffffffffffff90);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
        std::__cxx11::string::~string(local_78);
        std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff87);
      }
      else {
        fprintf(_stderr,
                "    [E] Failed reading the file. Probably not an ImDrawData session file?\n");
      }
      Session::~Session((Session *)0x10775b);
    }
    printf("\n");
    sVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&local_28);
    if (sVar1 == 0) {
      fprintf(_stderr,"[E] No valid files provided - nothing to do\n");
      local_4 = -1;
    }
    else {
      ImGui::DebugCheckVersionAndDataLayout
                ((char *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                 CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78),
                 (size_t)in_stack_ffffffffffffff70,(size_t)in_stack_ffffffffffffff68,
                 (size_t)in_stack_ffffffffffffff60,2,(size_t)in_stack_ffffffffffffff90);
      ImGui::CreateContext(in_stack_ffffffffffffff90);
      benchmark<ImDrawDataCompressor::XorRlePerDrawList>(in_stack_00000070);
      benchmark<ImDrawDataCompressor::XorRlePerDrawListWithVtxOffset>
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)session.frames.
                    super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      ImGui::DestroyContext((ImGuiContext *)0x10782f);
      local_4 = 0;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(in_stack_ffffffffffffff70);
  }
  return local_4;
}

Assistant:

int main(int argc , char ** argv) {
    printf("Usage: %s session0.imdd [session1.imdd] [session2.imdd] [...]\n", argv[0]);

    if (argc < 2) {
        return -1;
    }

    std::vector<std::string> fnameSessions;

    for (int i = 1; i < argc; ++i) {
        printf("[+] Session '%s' info:\n", argv[i]);
        Session session;
        if (session.load(argv[i]) == false) {
            fprintf(stderr, "    [E] Failed reading the file. Probably not an ImDrawData session file?\n");
        } else {
            session.printInfo();
            fnameSessions.push_back(argv[i]);
        }
    }
    printf("\n");

    if (fnameSessions.size() == 0) {
        fprintf(stderr, "[E] No valid files provided - nothing to do\n");
        return -1;
    }

    IMGUI_CHECKVERSION();
    ImGui::CreateContext();

    benchmark<ImDrawDataCompressor::XorRlePerDrawList>(fnameSessions);
    benchmark<ImDrawDataCompressor::XorRlePerDrawListWithVtxOffset>(fnameSessions);

    ImGui::DestroyContext();

    return 0;
}